

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void disas_simd_scalar_two_reg_misc(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  bool bVar1;
  _Bool _Var2;
  uint32_t rd_00;
  uint32_t rn_00;
  uint32_t uVar3;
  uint32_t uVar4;
  int val;
  TCGv_i64 tcg_rn_00;
  TCGv_i64 tcg_rd_00;
  TCGv_i32 tcg_dest;
  TCGv_i32 retval;
  TCGv_i32 pTVar5;
  bool u_00;
  TCGv_i32 tcg_shift_1;
  TCGv_i32 tcg_shift;
  NeonGenOneOpEnvFn *genfn;
  TCGv_i32 tcg_rd_1;
  TCGv_i32 tcg_rn_1;
  TCGv_i64 tcg_rd;
  TCGv_i64 tcg_rn;
  TCGv_ptr pTStack_48;
  _Bool is_signed;
  TCGv_ptr tcg_fpstatus;
  TCGv_i32 tcg_rmode;
  int rmode;
  _Bool is_fcvt;
  uint32_t uStack_2c;
  _Bool u;
  int size;
  int opcode;
  int rn;
  int rd;
  TCGContext_conflict1 *tcg_ctx;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  rd_00 = extract32(insn,0,5);
  rn_00 = extract32(insn,5,5);
  uStack_2c = extract32(insn,0xc,5);
  rmode = extract32(insn,0x16,2);
  uVar3 = extract32(insn,0x1d,1);
  u_00 = uVar3 != 0;
  bVar1 = false;
  switch(uStack_2c) {
  case 3:
    _Var2 = fp_access_check(s);
    if (!_Var2) {
      return;
    }
    handle_2misc_satacc(s,true,u_00,false,rmode,rn_00,rd_00);
    return;
  default:
    unallocated_encoding_aarch64(s);
    return;
  case 7:
    goto LAB_008354c4;
  case 10:
    if (u_00) {
      unallocated_encoding_aarch64(s);
      return;
    }
  case 8:
  case 9:
  case 0xb:
    if (rmode == 3) {
LAB_008354c4:
      _Var2 = fp_access_check(s);
      if (_Var2) {
        if (bVar1) {
          val = arm_rmode_to_sf_aarch64((uint)tcg_rmode);
          tcg_fpstatus = (TCGv_ptr)tcg_const_i32_aarch64(tcg_ctx_00,val);
          pTStack_48 = get_fpstatus_ptr_aarch64(tcg_ctx_00,false);
          gen_helper_set_rmode(tcg_ctx_00,(TCGv_i32)tcg_fpstatus,(TCGv_i32)tcg_fpstatus,pTStack_48);
        }
        else {
          tcg_fpstatus = (TCGv_ptr)0x0;
          pTStack_48 = (TCGv_ptr)0x0;
        }
        if (rmode == 3) {
          tcg_rn_00 = read_fp_dreg(s,rn_00);
          tcg_rd_00 = tcg_temp_new_i64(tcg_ctx_00);
          handle_2misc_64(s,uStack_2c,u_00,tcg_rd_00,tcg_rn_00,(TCGv_i32)tcg_fpstatus,pTStack_48);
          write_fp_dreg_aarch64(s,rd_00,tcg_rd_00);
          tcg_temp_free_i64(tcg_ctx_00,tcg_rd_00);
          tcg_temp_free_i64(tcg_ctx_00,tcg_rn_00);
        }
        else {
          tcg_dest = tcg_temp_new_i32(tcg_ctx_00);
          retval = tcg_temp_new_i32(tcg_ctx_00);
          read_vec_element_i32(s,tcg_dest,rn_00,0,rmode);
          if (uStack_2c == 7) {
            (*disas_simd_scalar_two_reg_misc::fns[rmode][u_00])
                      (tcg_ctx_00,retval,tcg_ctx_00->cpu_env,tcg_dest);
          }
          else if ((uStack_2c - 0x1a < 3) || (uStack_2c - 0x3a < 2)) {
            pTVar5 = tcg_const_i32_aarch64(tcg_ctx_00,0);
            gen_helper_vfp_tosls(tcg_ctx_00,retval,tcg_dest,pTVar5,pTStack_48);
            tcg_temp_free_i32(tcg_ctx_00,pTVar5);
          }
          else {
            if ((2 < uStack_2c - 0x5a) && (1 < uStack_2c - 0x7a)) {
              g_assertion_message_expr
                        ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                         ,0x28a4,(char *)0x0);
            }
            pTVar5 = tcg_const_i32_aarch64(tcg_ctx_00,0);
            gen_helper_vfp_touls(tcg_ctx_00,retval,tcg_dest,pTVar5,pTStack_48);
            tcg_temp_free_i32(tcg_ctx_00,pTVar5);
          }
          write_fp_sreg(s,rd_00,retval);
          tcg_temp_free_i32(tcg_ctx_00,retval);
          tcg_temp_free_i32(tcg_ctx_00,tcg_dest);
        }
        if (bVar1) {
          gen_helper_set_rmode(tcg_ctx_00,(TCGv_i32)tcg_fpstatus,(TCGv_i32)tcg_fpstatus,pTStack_48);
          tcg_temp_free_i32(tcg_ctx_00,(TCGv_i32)tcg_fpstatus);
          tcg_temp_free_ptr(tcg_ctx_00,pTStack_48);
        }
      }
    }
    else {
      unallocated_encoding_aarch64(s);
    }
    break;
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1f:
    uVar3 = extract32(rmode,1,1);
    uStack_2c = uStack_2c | uVar3 << 5 | (uint)u_00 << 6;
    uVar3 = extract32(rmode,0,1);
    rmode = -(uint)(uVar3 == 0) + 3;
    switch(uStack_2c) {
    case 0x1a:
    case 0x1b:
    case 0x3a:
    case 0x3b:
    case 0x5a:
    case 0x5b:
    case 0x7a:
    case 0x7b:
      uVar3 = extract32(uStack_2c,5,1);
      uVar4 = extract32(uStack_2c,0,1);
      tcg_rmode._0_4_ = uVar3 | uVar4 << 1;
      goto LAB_008354b4;
    case 0x1c:
    case 0x5c:
      tcg_rmode._0_4_ = 4;
LAB_008354b4:
      bVar1 = true;
      goto LAB_008354c4;
    case 0x1d:
    case 0x5d:
      _Var2 = fp_access_check(s);
      if (_Var2) {
        handle_simd_intfp_conv(s,rd_00,rn_00,1,(uint)(uStack_2c == 0x1d),0,rmode);
      }
      break;
    default:
      unallocated_encoding_aarch64(s);
      break;
    case 0x2c:
    case 0x2d:
    case 0x2e:
    case 0x6c:
    case 0x6d:
      handle_2misc_fcmp_zero(s,uStack_2c,true,u_00,true,rmode,rn_00,rd_00);
      break;
    case 0x3d:
    case 0x3f:
    case 0x7d:
      _Var2 = fp_access_check(s);
      if (_Var2) {
        handle_2misc_reciprocal(s,uStack_2c,true,u_00,true,rmode,rn_00,rd_00);
      }
      break;
    case 0x56:
      if (rmode == 2) {
        unallocated_encoding_aarch64(s);
      }
      else {
        _Var2 = fp_access_check(s);
        if (_Var2) {
          handle_2misc_narrow(s,true,uStack_2c,u_00,false,-(uint)(uVar3 == 0) + 2,rn_00,rd_00);
        }
      }
    }
    break;
  case 0x12:
    if (!u_00) {
      unallocated_encoding_aarch64(s);
      return;
    }
  case 0x14:
    if (rmode == 3) {
      unallocated_encoding_aarch64(s);
    }
    else {
      _Var2 = fp_access_check(s);
      if (_Var2) {
        handle_2misc_narrow(s,true,uStack_2c,u_00,false,rmode,rn_00,rd_00);
      }
    }
  }
  return;
}

Assistant:

static void disas_simd_scalar_two_reg_misc(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int opcode = extract32(insn, 12, 5);
    int size = extract32(insn, 22, 2);
    bool u = extract32(insn, 29, 1);
    bool is_fcvt = false;
    int rmode;
    TCGv_i32 tcg_rmode;
    TCGv_ptr tcg_fpstatus;

    switch (opcode) {
    case 0x3: /* USQADD / SUQADD*/
        if (!fp_access_check(s)) {
            return;
        }
        handle_2misc_satacc(s, true, u, false, size, rn, rd);
        return;
    case 0x7: /* SQABS / SQNEG */
        break;
    case 0xa: /* CMLT */
        if (u) {
            unallocated_encoding(s);
            return;
        }
        /* fall through */
    case 0x8: /* CMGT, CMGE */
    case 0x9: /* CMEQ, CMLE */
    case 0xb: /* ABS, NEG */
        if (size != 3) {
            unallocated_encoding(s);
            return;
        }
        break;
    case 0x12: /* SQXTUN */
        if (!u) {
            unallocated_encoding(s);
            return;
        }
        /* fall through */
    case 0x14: /* SQXTN, UQXTN */
        if (size == 3) {
            unallocated_encoding(s);
            return;
        }
        if (!fp_access_check(s)) {
            return;
        }
        handle_2misc_narrow(s, true, opcode, u, false, size, rn, rd);
        return;
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1f:
        /* Floating point: U, size[1] and opcode indicate operation;
         * size[0] indicates single or double precision.
         */
        opcode |= (extract32(size, 1, 1) << 5) | (u << 6);
        size = extract32(size, 0, 1) ? 3 : 2;
        switch (opcode) {
        case 0x2c: /* FCMGT (zero) */
        case 0x2d: /* FCMEQ (zero) */
        case 0x2e: /* FCMLT (zero) */
        case 0x6c: /* FCMGE (zero) */
        case 0x6d: /* FCMLE (zero) */
            handle_2misc_fcmp_zero(s, opcode, true, u, true, size, rn, rd);
            return;
        case 0x1d: /* SCVTF */
        case 0x5d: /* UCVTF */
        {
            bool is_signed = (opcode == 0x1d);
            if (!fp_access_check(s)) {
                return;
            }
            handle_simd_intfp_conv(s, rd, rn, 1, is_signed, 0, size);
            return;
        }
        case 0x3d: /* FRECPE */
        case 0x3f: /* FRECPX */
        case 0x7d: /* FRSQRTE */
            if (!fp_access_check(s)) {
                return;
            }
            handle_2misc_reciprocal(s, opcode, true, u, true, size, rn, rd);
            return;
        case 0x1a: /* FCVTNS */
        case 0x1b: /* FCVTMS */
        case 0x3a: /* FCVTPS */
        case 0x3b: /* FCVTZS */
        case 0x5a: /* FCVTNU */
        case 0x5b: /* FCVTMU */
        case 0x7a: /* FCVTPU */
        case 0x7b: /* FCVTZU */
            is_fcvt = true;
            rmode = extract32(opcode, 5, 1) | (extract32(opcode, 0, 1) << 1);
            break;
        case 0x1c: /* FCVTAS */
        case 0x5c: /* FCVTAU */
            /* TIEAWAY doesn't fit in the usual rounding mode encoding */
            is_fcvt = true;
            rmode = FPROUNDING_TIEAWAY;
            break;
        case 0x56: /* FCVTXN, FCVTXN2 */
            if (size == 2) {
                unallocated_encoding(s);
                return;
            }
            if (!fp_access_check(s)) {
                return;
            }
            handle_2misc_narrow(s, true, opcode, u, false, size - 1, rn, rd);
            return;
        default:
            unallocated_encoding(s);
            return;
        }
        break;
    default:
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    if (is_fcvt) {
        tcg_rmode = tcg_const_i32(tcg_ctx, arm_rmode_to_sf(rmode));
        tcg_fpstatus = get_fpstatus_ptr(tcg_ctx, false);
        gen_helper_set_rmode(tcg_ctx, tcg_rmode, tcg_rmode, tcg_fpstatus);
    } else {
        tcg_rmode = NULL;
        tcg_fpstatus = NULL;
    }

    if (size == 3) {
        TCGv_i64 tcg_rn = read_fp_dreg(s, rn);
        TCGv_i64 tcg_rd = tcg_temp_new_i64(tcg_ctx);

        handle_2misc_64(s, opcode, u, tcg_rd, tcg_rn, tcg_rmode, tcg_fpstatus);
        write_fp_dreg(s, rd, tcg_rd);
        tcg_temp_free_i64(tcg_ctx, tcg_rd);
        tcg_temp_free_i64(tcg_ctx, tcg_rn);
    } else {
        TCGv_i32 tcg_rn = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 tcg_rd = tcg_temp_new_i32(tcg_ctx);

        read_vec_element_i32(s, tcg_rn, rn, 0, size);

        switch (opcode) {
        case 0x7: /* SQABS, SQNEG */
        {
            NeonGenOneOpEnvFn *genfn;
            static NeonGenOneOpEnvFn * const fns[3][2] = {
                { gen_helper_neon_qabs_s8, gen_helper_neon_qneg_s8 },
                { gen_helper_neon_qabs_s16, gen_helper_neon_qneg_s16 },
                { gen_helper_neon_qabs_s32, gen_helper_neon_qneg_s32 },
            };
            genfn = fns[size][u];
            genfn(tcg_ctx, tcg_rd, tcg_ctx->cpu_env, tcg_rn);
            break;
        }
        case 0x1a: /* FCVTNS */
        case 0x1b: /* FCVTMS */
        case 0x1c: /* FCVTAS */
        case 0x3a: /* FCVTPS */
        case 0x3b: /* FCVTZS */
        {
            TCGv_i32 tcg_shift = tcg_const_i32(tcg_ctx, 0);
            gen_helper_vfp_tosls(tcg_ctx, tcg_rd, tcg_rn, tcg_shift, tcg_fpstatus);
            tcg_temp_free_i32(tcg_ctx, tcg_shift);
            break;
        }
        case 0x5a: /* FCVTNU */
        case 0x5b: /* FCVTMU */
        case 0x5c: /* FCVTAU */
        case 0x7a: /* FCVTPU */
        case 0x7b: /* FCVTZU */
        {
            TCGv_i32 tcg_shift = tcg_const_i32(tcg_ctx, 0);
            gen_helper_vfp_touls(tcg_ctx, tcg_rd, tcg_rn, tcg_shift, tcg_fpstatus);
            tcg_temp_free_i32(tcg_ctx, tcg_shift);
            break;
        }
        default:
            g_assert_not_reached();
        }

        write_fp_sreg(s, rd, tcg_rd);
        tcg_temp_free_i32(tcg_ctx, tcg_rd);
        tcg_temp_free_i32(tcg_ctx, tcg_rn);
    }

    if (is_fcvt) {
        gen_helper_set_rmode(tcg_ctx, tcg_rmode, tcg_rmode, tcg_fpstatus);
        tcg_temp_free_i32(tcg_ctx, tcg_rmode);
        tcg_temp_free_ptr(tcg_ctx, tcg_fpstatus);
    }
}